

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

int __thiscall smf::MidiMessage::getKeyNumber(MidiMessage *this)

{
  pointer puVar1;
  byte *pbVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  bVar3 = isNote(this);
  if (!bVar3) {
    pbVar2 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pbVar2 != 3) {
      return 0xffffffff;
    }
    if ((*pbVar2 & 0xf0) != 0xa0) {
      return 0xffffffff;
    }
  }
  puVar1 = (this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0xffffffff;
  if (1 < (ulong)((long)(this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1)) {
    uVar5 = (uint)puVar1[1];
  }
  uVar4 = 0xffffffff;
  if (-1 < (int)uVar5) {
    uVar4 = uVar5 & 0xff;
  }
  return uVar4;
}

Assistant:

int MidiMessage::getKeyNumber(void) const {
	if (isNote() || isAftertouch()) {
		int output = getP1();
		if (output < 0) {
			return output;
		} else {
			return 0xff & output;
		}
	} else {
		return -1;
	}
}